

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

void EncodeSetOrSequenceOf<SingleResponse>
               (DerType type,vector<SingleResponse,_std::allocator<SingleResponse>_> *in,uchar *pOut
               ,size_t cbOut,size_t *cbUsed)

{
  pointer pSVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  out_of_range *this;
  code *pcVar5;
  undefined *puVar6;
  size_t local_38;
  size_t cbInternal;
  
  local_38 = 0;
  if ((in->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (in->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    if (cbOut < 2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                ((overflow_error *)this,"Overflow in EncodeSetOrSequenceOf");
      puVar6 = &std::overflow_error::typeinfo;
      pcVar5 = std::overflow_error::~overflow_error;
      goto LAB_0011ddcc;
    }
    pOut[0] = '\x05';
    pOut[1] = '\0';
    sVar4 = 2;
  }
  else {
    *pOut = (uchar)type;
    sVar4 = GetEncodedSize<SingleResponse>(in);
    bVar2 = EncodeSize(sVar4,pOut + 1,cbOut - 1,&local_38);
    if (!bVar2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Error in EncodeSize");
      puVar6 = &std::out_of_range::typeinfo;
      pcVar5 = std::out_of_range::~out_of_range;
LAB_0011ddcc:
      __cxa_throw(this,puVar6,pcVar5);
    }
    sVar4 = local_38 + 1;
    uVar3 = 0;
    while( true ) {
      pSVar1 = (in->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(in->super__Vector_base<SingleResponse,_std::allocator<SingleResponse>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x1f8) <=
          (ulong)uVar3) break;
      SingleResponse::Encode(pSVar1 + uVar3,pOut + sVar4,cbOut - sVar4,&local_38);
      sVar4 = sVar4 + local_38;
      uVar3 = uVar3 + 1;
    }
  }
  *cbUsed = sVar4;
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}